

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_class.c
# Opt level: O2

void oonf_class_remove(oonf_class *ci)

{
  list_entity *plVar1;
  list_entity *plVar2;
  
  avl_remove(&_classes_tree,&ci->_node);
  _free_freelist(ci);
  plVar2 = (ci->_extensions).next;
  while (plVar2->prev != (ci->_extensions).prev) {
    plVar1 = plVar2->next;
    oonf_class_extension_remove((oonf_class_extension *)&plVar2[-4].prev);
    plVar2 = plVar1;
  }
  if ((log_global_mask[_oonf_class_subsystem.logging] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x99,
             (void *)0x0,0,"Class %s removed\n",ci->name);
  }
  return;
}

Assistant:

void
oonf_class_remove(struct oonf_class *ci) {
  struct oonf_class_extension *ext, *iterator;

  /* remove memcookie from tree */
  avl_remove(&_classes_tree, &ci->_node);

  /* remove all free memory blocks */
  _free_freelist(ci);

  /* remove all listeners */
  list_for_each_element_safe(&ci->_extensions, ext, _node, iterator) {
    oonf_class_extension_remove(ext);
  }

  OONF_DEBUG(LOG_CLASS, "Class %s removed\n", ci->name);
}